

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_8x16_avx2
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [32];
  __m128i *x6;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 (*pauVar34) [16];
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int i_1;
  __m128i d [8];
  __m128i dstvec [8];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  undefined1 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  __m128i *in_stack_fffffffffffff780;
  __m128i *in_stack_fffffffffffff788;
  __m128i *in_stack_fffffffffffff790;
  __m128i *in_stack_fffffffffffff798;
  __m128i *in_stack_fffffffffffff7a0;
  undefined8 local_800 [18];
  long local_770;
  long local_768;
  undefined8 local_760;
  int local_71c;
  int local_718;
  int local_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  int local_678;
  uint local_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [32];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  __m128i *palStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  int local_588;
  int local_584;
  byte local_57c;
  undefined8 *local_570;
  undefined4 local_568;
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  __m128i *palStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  ushort local_4c8;
  ushort local_4c6;
  undefined2 local_4c4;
  undefined2 local_4c2;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_490;
  undefined8 uStack_488;
  uint8_t local_480 [8];
  uint8_t auStack_478 [8];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined8 uStack_450;
  __m128i *palVar39;
  __m128i *d10d11;
  __m128i *d12d13;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_a0;
  undefined8 uStack_98;
  
  local_564 = 0x10;
  local_568 = 8;
  local_57c = (byte)in_ECX;
  iVar31 = 0x17 << (local_57c & 0x1f);
  local_4c2 = 0x10;
  auVar36 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar36 = vpinsrw_avx(auVar36,0x10,2);
  auVar36 = vpinsrw_avx(auVar36,0x10,3);
  auVar36 = vpinsrw_avx(auVar36,0x10,4);
  auVar36 = vpinsrw_avx(auVar36,0x10,5);
  auVar36 = vpinsrw_avx(auVar36,0x10,6);
  auVar2 = vpinsrw_avx(auVar36,0x10,7);
  auVar36 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar36 = vpinsrw_avx(auVar36,0x10,2);
  auVar36 = vpinsrw_avx(auVar36,0x10,3);
  auVar36 = vpinsrw_avx(auVar36,0x10,4);
  auVar36 = vpinsrw_avx(auVar36,0x10,5);
  auVar36 = vpinsrw_avx(auVar36,0x10,6);
  auVar3 = vpinsrw_avx(auVar36,0x10,7);
  local_460._0_8_ = auVar2._0_8_;
  local_460._8_8_ = auVar2._8_8_;
  uStack_450 = auVar3._0_8_;
  palVar39 = auVar3._8_8_;
  local_620 = local_460._0_8_;
  uStack_618 = local_460._8_8_;
  uStack_610 = uStack_450;
  bVar1 = *(byte *)(in_RDX + iVar31);
  auVar36 = vpinsrb_avx(ZEXT116(bVar1),(uint)bVar1,1);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,2);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,3);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,4);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,5);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,6);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,7);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,8);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,9);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,10);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,0xb);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,0xc);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,0xd);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,0xe);
  auVar36 = vpinsrb_avx(auVar36,(uint)bVar1,0xf);
  local_a0 = auVar36._0_8_;
  uStack_98 = auVar36._8_8_;
  local_670 = local_a0;
  uStack_668 = uStack_98;
  local_4c4 = 0x3f;
  auVar37 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar37 = vpinsrw_avx(auVar37,0x3f,2);
  auVar37 = vpinsrw_avx(auVar37,0x3f,3);
  auVar37 = vpinsrw_avx(auVar37,0x3f,4);
  auVar37 = vpinsrw_avx(auVar37,0x3f,5);
  auVar37 = vpinsrw_avx(auVar37,0x3f,6);
  auVar37 = vpinsrw_avx(auVar37,0x3f,7);
  auVar35 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar35 = vpinsrw_avx(auVar35,0x3f,2);
  auVar35 = vpinsrw_avx(auVar35,0x3f,3);
  auVar35 = vpinsrw_avx(auVar35,0x3f,4);
  auVar35 = vpinsrw_avx(auVar35,0x3f,5);
  auVar35 = vpinsrw_avx(auVar35,0x3f,6);
  auVar35 = vpinsrw_avx(auVar35,0x3f,7);
  auVar35 = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar35;
  auVar37 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar37;
  d10d11 = auVar37._0_8_;
  d12d13 = auVar37._8_8_;
  local_678 = 0;
  local_674 = in_R8D;
  while( true ) {
    if (7 < local_678) goto LAB_005d8121;
    iVar32 = (int)local_674 >> ((byte)(6 - in_ECX) & 0x1f);
    iVar33 = iVar31 - iVar32 >> (local_57c & 0x1f);
    local_718 = iVar33;
    local_714 = iVar32;
    if (iVar33 < 1) break;
    if (0x10 < iVar33) {
      local_718 = 0x10;
    }
    pauVar34 = (undefined1 (*) [16])(in_RDX + iVar32);
    local_700 = *pauVar34;
    local_710 = *(undefined1 (*) [16])(in_RDX + iVar32 + 1);
    if (in_ECX == 0) {
      local_4c8 = (ushort)local_674;
      auVar4 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,7);
      auVar38 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
      uStack_390 = auVar38._0_8_;
      uStack_388 = auVar38._8_8_;
      auVar6._16_8_ = uStack_390;
      auVar6._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
      auVar6._24_8_ = uStack_388;
      auVar10._16_8_ = d10d11;
      auVar10._0_16_ = auVar35;
      auVar10._24_8_ = d12d13;
      auVar10 = vpand_avx2(auVar6,auVar10);
      local_6e0 = vpsrlw_avx2(auVar10,ZEXT416(1));
    }
    else {
      local_480 = (uint8_t  [8])EvenOddMaskx[0]._0_8_;
      auStack_478 = (uint8_t  [8])EvenOddMaskx[0]._8_8_;
      auVar4._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar4._0_8_ = EvenOddMaskx[0]._0_8_;
      local_700 = vpshufb_avx(*pauVar34,auVar4);
      local_710 = vpsrldq_avx(local_700,8);
      local_4c6 = (ushort)local_674;
      auVar4 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,7);
      auVar38 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
      uStack_3d0 = auVar38._0_8_;
      uStack_3c8 = auVar38._8_8_;
      auVar8._16_8_ = uStack_3d0;
      auVar8._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
      auVar8._24_8_ = uStack_3c8;
      auVar10 = vpsllw_avx2(auVar8,ZEXT416(in_ECX));
      auVar7._16_8_ = d10d11;
      auVar7._0_16_ = auVar35;
      auVar7._24_8_ = d12d13;
      auVar10 = vpand_avx2(auVar10,auVar7);
      local_6e0 = vpsrlw_avx2(auVar10,ZEXT416(1));
      local_470 = *(undefined8 *)*pauVar34;
      uStack_468 = *(undefined8 *)(*pauVar34 + 8);
    }
    auVar7 = vpmovzxbw_avx2(local_700);
    auVar8 = vpmovzxbw_avx2(local_710);
    auVar11 = vpsubw_avx2(auVar8,auVar7);
    auVar10 = vpsllw_avx2(auVar7,ZEXT416(5));
    local_600._0_8_ = auVar10._0_8_;
    uVar14 = local_600._0_8_;
    local_600._8_8_ = auVar10._8_8_;
    uVar15 = local_600._8_8_;
    local_600._16_8_ = auVar10._16_8_;
    uVar16 = local_600._16_8_;
    local_600._24_8_ = auVar10._24_8_;
    uVar17 = local_600._24_8_;
    auVar9._16_8_ = uStack_450;
    auVar9._0_16_ = auVar2;
    auVar9._24_8_ = palVar39;
    auVar6 = vpaddw_avx2(auVar10,auVar9);
    auVar9 = vpmullw_avx2(auVar11,local_6e0);
    local_600._0_8_ = auVar6._0_8_;
    uVar18 = local_600._0_8_;
    local_600._8_8_ = auVar6._8_8_;
    uVar19 = local_600._8_8_;
    local_600._16_8_ = auVar6._16_8_;
    uVar20 = local_600._16_8_;
    local_600._24_8_ = auVar6._24_8_;
    uVar21 = local_600._24_8_;
    local_6a0._0_8_ = auVar9._0_8_;
    uVar22 = local_6a0._0_8_;
    local_6a0._8_8_ = auVar9._8_8_;
    uVar23 = local_6a0._8_8_;
    local_6a0._16_8_ = auVar9._16_8_;
    uVar24 = local_6a0._16_8_;
    local_6a0._24_8_ = auVar9._24_8_;
    uVar25 = local_6a0._24_8_;
    auVar10 = vpaddw_avx2(auVar6,auVar9);
    auVar10 = vpsrlw_avx2(auVar10,ZEXT416(5));
    local_6c0._16_8_ = auVar10._16_8_;
    local_6c0._24_8_ = auVar10._24_8_;
    uVar12 = local_6c0._16_8_;
    uVar13 = local_6c0._24_8_;
    auVar30._16_16_ = ZEXT416(5);
    auVar30._0_16_ = auVar10._16_16_;
    auVar10 = vpackuswb_avx2(auVar10,auVar30);
    local_6c0._0_8_ = auVar10._0_8_;
    uVar26 = local_6c0._0_8_;
    local_6c0._8_8_ = auVar10._8_8_;
    uVar27 = local_6c0._8_8_;
    local_6c0._16_8_ = auVar10._16_8_;
    uVar28 = local_6c0._16_8_;
    local_6c0._24_8_ = auVar10._24_8_;
    uVar29 = local_6c0._24_8_;
    auVar4 = vpblendvb_avx(auVar36,auVar10._0_16_,*(undefined1 (*) [16])BaseMask[local_718]);
    *(undefined1 (*) [16])(local_800 + (long)local_678 * 2) = auVar4;
    local_674 = in_R8D + local_674;
    local_678 = local_678 + 1;
    local_6f0 = local_6c0._0_8_;
    uStack_6e8 = local_6c0._8_8_;
    local_6c0 = auVar10;
    local_6a0 = auVar9;
    local_640 = auVar11;
    local_600 = auVar6;
    local_5e0 = auVar8;
    local_5c0 = auVar7;
    local_560 = uVar22;
    uStack_558 = uVar23;
    uStack_550 = uVar24;
    uStack_548 = uVar25;
    local_540 = uVar18;
    uStack_538 = uVar19;
    uStack_530 = uVar20;
    uStack_528 = uVar21;
    local_520 = local_460._0_8_;
    uStack_518 = local_460._8_8_;
    uStack_510 = uStack_450;
    palStack_508 = palVar39;
    local_500 = uVar14;
    uStack_4f8 = uVar15;
    uStack_4f0 = uVar16;
    uStack_4e8 = uVar17;
    local_4c0 = uVar26;
    uStack_4b8 = uVar27;
    uStack_4b0 = uVar28;
    uStack_4a8 = uVar29;
    local_490 = uVar12;
    uStack_488 = uVar13;
  }
  for (local_71c = local_678; local_71c < 8; local_71c = local_71c + 1) {
    local_800[(long)local_71c * 2] = local_a0;
    local_800[(long)local_71c * 2 + 1] = uStack_98;
  }
LAB_005d8121:
  local_770 = in_RSI;
  local_768 = in_RDI;
  palStack_608 = palVar39;
  local_588 = iVar31;
  local_584 = 6 - in_ECX;
  local_570 = local_800;
  local_460 = auVar2;
  x6 = palVar39;
  _uStack_450 = auVar3;
  local_660 = auVar35;
  auStack_650 = auVar37;
  transpose8x16_16x8_sse2
            (in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,in_stack_fffffffffffff790,
             in_stack_fffffffffffff788,in_stack_fffffffffffff780,
             (__m128i *)
             CONCAT44(in_stack_fffffffffffff77c,
                      CONCAT22(0x3f,CONCAT11(bVar1,in_stack_fffffffffffff778))),x6,
             (__m128i *)0x10001000100010,(__m128i *)0x10001000100010,(__m128i *)0x10001000100010,
             (__m128i *)0x10001000100010,auVar35._0_8_,auVar35._8_8_,d10d11,d12d13,
             (__m128i *)0x3f003f003f003f);
  for (iVar31 = 0; iVar31 < 8; iVar31 = iVar31 + 1) {
    *(undefined8 *)(local_768 + iVar31 * local_770) =
         *(undefined8 *)(&stack0xfffffffffffff780 + (long)iVar31 * 0x10);
    auVar36 = vpsrldq_avx(*(undefined1 (*) [16])(&stack0xfffffffffffff780 + (long)iVar31 * 0x10),8);
    local_760 = auVar36._0_8_;
    *(undefined8 *)(local_768 + (iVar31 + 8) * local_770) = local_760;
  }
  return;
}

Assistant:

static void dr_prediction_z3_8x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *left, int upsample_left,
                                       int dy) {
  __m128i dstvec[8], d[8];

  dr_prediction_z1_HxW_internal_avx2(16, 8, dstvec, left, upsample_left, dy);
  transpose8x16_16x8_sse2(dstvec, dstvec + 1, dstvec + 2, dstvec + 3,
                          dstvec + 4, dstvec + 5, dstvec + 6, dstvec + 7, d,
                          d + 1, d + 2, d + 3, d + 4, d + 5, d + 6, d + 7);
  for (int i = 0; i < 8; i++) {
    _mm_storel_epi64((__m128i *)(dst + i * stride), d[i]);
    _mm_storel_epi64((__m128i *)(dst + (i + 8) * stride),
                     _mm_srli_si128(d[i], 8));
  }
}